

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

aiScene * aiApplyPostProcessing(aiScene *pScene,uint pFlags)

{
  ScenePrivateData *pSVar1;
  aiScene *paVar2;
  undefined8 extraout_RAX;
  
  pSVar1 = Assimp::ScenePriv(pScene);
  if ((pSVar1 == (ScenePrivateData *)0x0) || (pSVar1->mOrigImporter == (Importer *)0x0)) {
    ReportSceneNotFoundError();
    __cxa_begin_catch(extraout_RAX);
    __cxa_end_catch();
  }
  else {
    paVar2 = Assimp::Importer::ApplyPostProcessing(pSVar1->mOrigImporter,pFlags);
    if (paVar2 != (aiScene *)0x0) {
      return paVar2;
    }
    aiReleaseImport(pScene);
  }
  return (aiScene *)0x0;
}

Assistant:

ASSIMP_API const aiScene* aiApplyPostProcessing(const aiScene* pScene,
    unsigned int pFlags)
{
    const aiScene* sc = NULL;


    ASSIMP_BEGIN_EXCEPTION_REGION();

    // find the importer associated with this data
    const ScenePrivateData* priv = ScenePriv(pScene);
    if( !priv || !priv->mOrigImporter)  {
        ReportSceneNotFoundError();
        return NULL;
    }

    sc = priv->mOrigImporter->ApplyPostProcessing(pFlags);

    if (!sc) {
        aiReleaseImport(pScene);
        return NULL;
    }

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return sc;
}